

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O1

void __thiscall
glslang::HlslParseContext::decomposeStructBufferMethods
          (HlslParseContext *this,TSourceLoc *loc,TIntermTyped **node,TIntermNode *arguments)

{
  void *__src;
  byte bVar1;
  void *__dest;
  bool bVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  TBasicType t;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar8;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  TIntermTyped *pTVar9;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  TVariable *pTVar10;
  TIntermSymbol *pTVar11;
  TIntermSymbol *index;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  TIntermAggregate *left;
  undefined4 extraout_var_08;
  TIntermAggregate *pTVar12;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  TIntermConstantUnion *pTVar13;
  undefined4 extraout_var_11;
  TIntermTyped *pTVar14;
  TIntermTyped *pTVar15;
  undefined4 extraout_var_12;
  TIntermBinary *pTVar16;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  _func_int **pp_Var17;
  long lVar18;
  long lVar19;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  TIntermTyped *left_00;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  size_t __n;
  TIntermediate *pTVar20;
  int idx;
  TIntermTyped *bufferObj;
  anon_class_24_3_252b1faa incDecCounter;
  TType derefType;
  TType indexType;
  TIntermTyped *local_1b8;
  int local_1a0;
  TIntermTyped *local_198;
  TIntermTyped **local_190;
  TIntermSymbol *local_188;
  anon_class_24_3_252b1faa local_180;
  TIntermAggregate *local_168;
  TType local_160;
  TType local_c8;
  long *plVar7;
  undefined4 extraout_var_15;
  
  if (*node == (TIntermTyped *)0x0) {
    return;
  }
  iVar4 = (*((*node)->super_TIntermNode)._vptr_TIntermNode[4])();
  if (arguments == (TIntermNode *)0x0) {
    return;
  }
  if (CONCAT44(extraout_var,iVar4) == 0) {
    return;
  }
  iVar4 = (*((*node)->super_TIntermNode)._vptr_TIntermNode[4])();
  iVar4 = *(int *)(CONCAT44(extraout_var_00,iVar4) + 0xb8);
  iVar5 = (*arguments->_vptr_TIntermNode[6])(arguments);
  plVar7 = (long *)CONCAT44(extraout_var_01,iVar5);
  local_198 = (TIntermTyped *)0x0;
  if (plVar7 == (long *)0x0) {
    iVar5 = (*arguments->_vptr_TIntermNode[0xc])(arguments);
    local_198 = (TIntermTyped *)CONCAT44(extraout_var_02,iVar5);
  }
  else {
    lVar8 = (**(code **)(*plVar7 + 400))(plVar7);
    if (*(long *)(lVar8 + 8) == *(long *)(lVar8 + 0x10)) {
      return;
    }
    lVar8 = (**(code **)(*plVar7 + 400))(plVar7);
    if (**(long **)(lVar8 + 8) != 0) {
      lVar8 = (**(code **)(*plVar7 + 400))(plVar7);
      local_198 = (TIntermTyped *)(**(code **)(*(long *)**(undefined8 **)(lVar8 + 8) + 0x18))();
    }
  }
  if (local_198 == (TIntermTyped *)0x0) {
    return;
  }
  iVar5 = (*(local_198->super_TIntermNode)._vptr_TIntermNode[0xc])();
  if (CONCAT44(extraout_var_03,iVar5) == 0) {
    return;
  }
  local_180.bufferObj = &local_198;
  local_180.this = this;
  local_180.loc = loc;
  pTVar9 = indexStructBufferContent(this,loc,local_198);
  if (pTVar9 == (TIntermTyped *)0x0) {
    return;
  }
  local_190 = node;
  switch(iVar4) {
  case 0x2a1:
  case 0x2a2:
  case 0x2a3:
  case 0x2a4:
  case 0x2a5:
  case 0x2a6:
  case 0x2a7:
  case 0x2a8:
  case 0x2a9:
    lVar8 = (**(code **)(*plVar7 + 400))(plVar7);
    pTVar14 = (TIntermTyped *)(**(code **)(**(long **)(*(long *)(lVar8 + 8) + 8) + 0x18))();
    pTVar14 = makeIntegerIndex(this,pTVar14);
    pTVar20 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    pTVar13 = TIntermediate::addConstantUnion(pTVar20,2,loc,true);
    TType::TType(&local_160,EbtInt,EvqTemporary,1,0,0,false);
    pTVar16 = TIntermediate::addBinaryNode
                        (pTVar20,EOpRightShift,pTVar14,&pTVar13->super_TIntermTyped,loc,&local_160);
    iVar4 = (*(pTVar16->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
              _vptr_TIntermNode[0x21])(pTVar16);
    pTVar14 = TIntermediate::addIndex
                        ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                         ((*(uint *)(CONCAT44(extraout_var_04,iVar4) + 8) & 0x7f) != 2) +
                         EOpIndexDirect,pTVar9,(TIntermTyped *)pTVar16,loc);
    iVar4 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar9);
    TType::TType(&local_160,(TType *)CONCAT44(extraout_var_05,iVar4),0,false);
    (*(pTVar14->super_TIntermNode)._vptr_TIntermNode[0x1d])(pTVar14,&local_160);
    *(TIntermTyped **)(*(long *)(lVar8 + 8) + 8) = pTVar14;
    __dest = *(void **)(lVar8 + 8);
    __src = (void *)((long)__dest + 8);
    __n = *(long *)(lVar8 + 0x10) - (long)__src;
    if (__n != 0) {
      memmove(__dest,__src,__n);
    }
    lVar18 = (long)__dest + (*(long *)(lVar8 + 0x10) - (long)__src);
    if (*(long *)(lVar8 + 0x10) != lVar18) {
      *(long *)(lVar8 + 0x10) = lVar18;
    }
    break;
  case 700:
    lVar8 = (**(code **)(*plVar7 + 400))(plVar7);
    pTVar14 = (TIntermTyped *)(**(code **)(**(long **)(*(long *)(lVar8 + 8) + 8) + 0x18))();
    pTVar16 = (TIntermBinary *)makeIntegerIndex(this,pTVar14);
    iVar4 = (*(local_198->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    lVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_13,iVar4) + 0x58))
                      ((long *)CONCAT44(extraout_var_13,iVar4));
    if ((*(ushort *)(lVar8 + 10) & 0x1ff) - 0x99 < 2) {
      pTVar20 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      pTVar13 = TIntermediate::addConstantUnion(pTVar20,2,loc,true);
      TType::TType(&local_160,EbtInt,EvqTemporary,1,0,0,false);
      pTVar16 = TIntermediate::addBinaryNode
                          (pTVar20,EOpRightShift,(TIntermTyped *)pTVar16,
                           &pTVar13->super_TIntermTyped,loc,&local_160);
    }
    iVar4 = (*(pTVar16->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
              _vptr_TIntermNode[0x21])(pTVar16);
    pTVar14 = TIntermediate::addIndex
                        ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                         ((*(uint *)(CONCAT44(extraout_var_14,iVar4) + 8) & 0x7f) != 2) +
                         EOpIndexDirect,pTVar9,(TIntermTyped *)pTVar16,loc);
    *node = pTVar14;
    pp_Var17 = (pTVar9->super_TIntermNode)._vptr_TIntermNode;
    goto LAB_0038a7c1;
  case 0x2bd:
    lVar18 = (**(code **)(*plVar7 + 400))(plVar7);
    lVar8 = *(long *)(lVar18 + 0x10);
    lVar18 = *(long *)(lVar18 + 8);
    lVar19 = (**(code **)(*plVar7 + 400))(plVar7);
    pTVar14 = (TIntermTyped *)(**(code **)(**(long **)(*(long *)(lVar19 + 8) + 8) + 0x18))();
    if ((int)((ulong)(lVar8 - lVar18) >> 3) < 3) {
      local_1b8 = (TIntermTyped *)0x0;
    }
    else {
      lVar8 = (**(code **)(*plVar7 + 400))(plVar7);
      local_1b8 = (TIntermTyped *)(**(code **)(**(long **)(*(long *)(lVar8 + 8) + 0x10) + 0x18))();
    }
    iVar4 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar9);
    cVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_20,iVar4) + 0xf0))
                      ((long *)CONCAT44(extraout_var_20,iVar4));
    if (cVar3 == '\0') {
      pTVar20 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      iVar4 = (*(pTVar14->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar14);
      pTVar13 = (TIntermConstantUnion *)
                TIntermediate::addBuiltInFunctionCall
                          (pTVar20,loc,EOpArrayLength,true,&pTVar9->super_TIntermNode,
                           (TType *)CONCAT44(extraout_var_22,iVar4));
      pTVar20 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    }
    else {
      iVar4 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar9);
      iVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_21,iVar4) + 0x78))
                        ((long *)CONCAT44(extraout_var_21,iVar4));
      pTVar20 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      pTVar13 = TIntermediate::addConstantUnion(pTVar20,iVar4,loc,true);
    }
    pTVar14 = TIntermediate::addAssign(pTVar20,EOpAssign,pTVar14,&pTVar13->super_TIntermTyped,loc);
    pTVar12 = TIntermediate::growAggregate
                        ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                         (TIntermNode *)0x0,&pTVar14->super_TIntermNode,loc);
    if (local_1b8 != (TIntermTyped *)0x0) {
      iVar4 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar9);
      iVar5 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar9);
      lVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_24,iVar5) + 0x58))
                        ((long *)CONCAT44(extraout_var_24,iVar5));
      bVar1 = *(byte *)(lVar8 + 0x10);
      iVar5 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x1e])();
      lVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_25,iVar5) + 0x58))
                        ((long *)CONCAT44(extraout_var_25,iVar5));
      TIntermediate::getMemberAlignment
                ((TType *)CONCAT44(extraout_var_23,iVar4),(int *)&local_160,(int *)&local_c8,
                 bVar1 & 0xf,(uint)((ulong)*(undefined8 *)(lVar8 + 8) >> 0x3d) == 1);
      pTVar20 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      pTVar13 = TIntermediate::addConstantUnion(pTVar20,(int)local_c8._vptr_TType,loc,true);
      pTVar9 = TIntermediate::addAssign
                         (pTVar20,EOpAssign,local_1b8,&pTVar13->super_TIntermTyped,loc);
      pTVar12 = TIntermediate::growAggregate
                          ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                           (TIntermNode *)pTVar12,&pTVar9->super_TIntermNode);
    }
    (*(pTVar12->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[0x31])
              (pTVar12,1);
    *node = (TIntermTyped *)pTVar12;
    break;
  case 0x2c2:
  case 0x2c3:
  case 0x2c4:
    lVar8 = (**(code **)(*plVar7 + 400))(plVar7);
    pTVar14 = (TIntermTyped *)(**(code **)(**(long **)(*(long *)(lVar8 + 8) + 8) + 0x18))();
    pTVar14 = makeIntegerIndex(this,pTVar14);
    if (2 < iVar4 - 0x2c2U) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp"
                    ,0xde6,
                    "void glslang::HlslParseContext::decomposeStructBufferMethods(const TSourceLoc &, TIntermTyped *&, TIntermNode *)"
                   );
    }
    local_188 = (TIntermSymbol *)(ulong)(iVar4 - 0x147);
    pTVar20 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    pTVar13 = TIntermediate::addConstantUnion(pTVar20,2,loc,true);
    TType::TType(&local_160,EbtInt,EvqTemporary,1,0,0,false);
    pTVar16 = TIntermediate::addBinaryNode
                        (pTVar20,EOpRightShift,pTVar14,&pTVar13->super_TIntermTyped,loc,&local_160);
    TType::TType(&local_160,EbtInt,EvqTemporary,1,0,0,false);
    pTVar10 = makeInternalVariable(this,"byteAddrTemp",&local_160);
    pTVar11 = TIntermediate::addSymbol
                        ((this->super_TParseContextBase).super_TParseVersions.intermediate,pTVar10,
                         loc);
    pTVar20 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    pTVar14 = TIntermediate::addAssign
                        (pTVar20,EOpAssign,&pTVar11->super_TIntermTyped,(TIntermTyped *)pTVar16,loc)
    ;
    local_168 = TIntermediate::growAggregate(pTVar20,(TIntermNode *)0x0,&pTVar14->super_TIntermNode)
    ;
    left = (TIntermAggregate *)0x0;
    iVar5 = 0;
    do {
      index = pTVar11;
      if (iVar5 != 0) {
        pTVar20 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        pTVar13 = TIntermediate::addConstantUnion(pTVar20,iVar5,loc,true);
        TType::TType(&local_160,EbtInt,EvqTemporary,1,0,0,false);
        index = (TIntermSymbol *)
                TIntermediate::addBinaryNode
                          (pTVar20,EOpAdd,&pTVar11->super_TIntermTyped,&pTVar13->super_TIntermTyped,
                           loc,&local_160);
      }
      iVar6 = (*(index->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])(index);
      pTVar14 = TIntermediate::addIndex
                          ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                           ((*(uint *)(CONCAT44(extraout_var_06,iVar6) + 8) & 0x7f) != 2) +
                           EOpIndexDirect,pTVar9,&index->super_TIntermTyped,loc);
      iVar6 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar9);
      TType::TType(&local_160,(TType *)CONCAT44(extraout_var_07,iVar6),0,false);
      local_160.qualifier.semanticName = (char *)0x0;
      local_160.qualifier._16_1_ = local_160.qualifier._16_1_ & 0xf0;
      local_160.qualifier.layoutOffset = -1;
      local_160.qualifier.layoutAlign = -1;
      local_160.qualifier._28_8_ = local_160.qualifier._28_8_ & 0xffffffdf8000 | 0xffffffff001fcfff;
      local_160.qualifier.layoutPushConstant = false;
      local_160.qualifier.layoutBufferReference = false;
      local_160.qualifier.layoutPassthrough = false;
      local_160.qualifier.layoutViewportRelative = false;
      local_160.qualifier.layoutSecondaryViewportRelativeOffset = -0x800;
      local_160.qualifier.layoutBindlessSampler = false;
      local_160.qualifier.layoutBindlessImage = false;
      local_160.qualifier.layoutShaderRecord = false;
      local_160.qualifier.layoutFullQuads = false;
      local_160.qualifier.layoutQuadDeriv = false;
      local_160.qualifier.layoutHitObjectShaderRecordNV = false;
      local_160.qualifier.spirvStorageClass = -1;
      local_160.qualifier._44_1_ = 0;
      local_160.qualifier._36_8_ = local_160.qualifier._36_8_ | 0x1ffffff7fffffff;
      local_160.qualifier.spirvDecorate = (TSpirvDecorate *)0x0;
      local_160.qualifier._8_8_ = local_160.qualifier._8_8_ & 0x141fff0000;
      (*(pTVar14->super_TIntermNode)._vptr_TIntermNode[0x1d])(pTVar14,&local_160);
      left = TIntermediate::growAggregate
                       ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                        (TIntermNode *)left,&pTVar14->super_TIntermNode);
      iVar5 = iVar5 + 1;
    } while (iVar4 + -0x2c0 != iVar5);
    t = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x20])(pTVar9);
    TType::TType(&local_160,t,EvqTemporary,iVar4 + -0x2c0,0,0,false);
    (*(left->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[0x1d])
              (left,&local_160);
    iVar4 = (*(left->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [6])(left);
    (**(code **)(*(long *)CONCAT44(extraout_var_08,iVar4) + 0x188))
              ((long *)CONCAT44(extraout_var_08,iVar4),local_188);
    pTVar12 = TIntermediate::growAggregate
                        ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                         (TIntermNode *)local_168,(TIntermNode *)left);
    iVar4 = (*(left->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x1e])(left);
    (*(pTVar12->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[0x1d])
              (pTVar12,CONCAT44(extraout_var_09,iVar4));
    iVar4 = (*(pTVar12->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
              _vptr_TIntermNode[6])(pTVar12);
    (**(code **)(*(long *)CONCAT44(extraout_var_10,iVar4) + 0x188))
              ((long *)CONCAT44(extraout_var_10,iVar4),1);
    goto LAB_0038ab3f;
  case 0x2c5:
  case 0x2c6:
  case 0x2c7:
  case 0x2c8:
    lVar8 = (**(code **)(*plVar7 + 400))(plVar7);
    pTVar14 = (TIntermTyped *)(**(code **)(**(long **)(*(long *)(lVar8 + 8) + 8) + 0x18))();
    pTVar14 = makeIntegerIndex(this,pTVar14);
    lVar8 = (**(code **)(*plVar7 + 400))(plVar7);
    pTVar15 = (TIntermTyped *)(**(code **)(**(long **)(*(long *)(lVar8 + 8) + 0x10) + 0x18))();
    switch(iVar4) {
    case 0x2c5:
      local_1a0 = 1;
      bVar2 = true;
      goto LAB_0038a8d8;
    case 0x2c6:
      local_1a0 = 2;
      break;
    case 0x2c7:
      local_1a0 = 3;
      break;
    case 0x2c8:
      local_1a0 = 4;
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp"
                    ,0xe2e,
                    "void glslang::HlslParseContext::decomposeStructBufferMethods(const TSourceLoc &, TIntermTyped *&, TIntermNode *)"
                   );
    }
    bVar2 = false;
LAB_0038a8d8:
    pTVar20 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    pTVar13 = TIntermediate::addConstantUnion(pTVar20,2,loc,true);
    iVar4 = 0;
    TType::TType(&local_160,EbtInt,EvqTemporary,1,0,0,false);
    pTVar16 = TIntermediate::addBinaryNode
                        (pTVar20,EOpRightShift,pTVar14,&pTVar13->super_TIntermTyped,loc,&local_160);
    TType::TType(&local_160,EbtInt,EvqTemporary,1,0,0,false);
    pTVar10 = makeInternalVariable(this,"byteAddrTemp",&local_160);
    local_188 = TIntermediate::addSymbol
                          ((this->super_TParseContextBase).super_TParseVersions.intermediate,pTVar10
                           ,loc);
    pTVar20 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    pTVar14 = TIntermediate::addAssign
                        (pTVar20,EOpAssign,&local_188->super_TIntermTyped,(TIntermTyped *)pTVar16,
                         loc);
    pTVar12 = TIntermediate::growAggregate(pTVar20,(TIntermNode *)0x0,&pTVar14->super_TIntermNode);
    do {
      pTVar13 = TIntermediate::addConstantUnion
                          ((this->super_TParseContextBase).super_TParseVersions.intermediate,iVar4,
                           loc,true);
      pTVar11 = local_188;
      if (iVar4 != 0) {
        pTVar20 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        TType::TType(&local_160,EbtInt,EvqTemporary,1,0,0,false);
        pTVar11 = (TIntermSymbol *)
                  TIntermediate::addBinaryNode
                            (pTVar20,EOpAdd,&pTVar11->super_TIntermTyped,
                             &pTVar13->super_TIntermTyped,loc,&local_160);
      }
      iVar5 = (*(pTVar11->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])(pTVar11);
      left_00 = TIntermediate::addIndex
                          ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                           ((*(uint *)(CONCAT44(extraout_var_17,iVar5) + 8) & 0x7f) != 2) +
                           EOpIndexDirect,pTVar9,&pTVar11->super_TIntermTyped,loc);
      iVar5 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar9);
      TType::TType(&local_160,(TType *)CONCAT44(extraout_var_18,iVar5),0,false);
      (*(left_00->super_TIntermNode)._vptr_TIntermNode[0x1d])(left_00,&local_160);
      pTVar14 = pTVar15;
      if (!bVar2) {
        pTVar14 = TIntermediate::addIndex
                            ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                             EOpIndexDirect,pTVar15,&pTVar13->super_TIntermTyped,loc);
        iVar5 = (*(pTVar15->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar15);
        TType::TType(&local_c8,(TType *)CONCAT44(extraout_var_19,iVar5),0,false);
        (*(pTVar14->super_TIntermNode)._vptr_TIntermNode[0x1d])(pTVar14,&local_c8);
      }
      pTVar14 = TIntermediate::addAssign
                          ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                           EOpAssign,left_00,pTVar14,loc);
      pTVar12 = TIntermediate::growAggregate
                          ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                           (TIntermNode *)pTVar12,&pTVar14->super_TIntermNode);
      iVar4 = iVar4 + 1;
    } while (local_1a0 != iVar4);
    (*(pTVar12->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[0x31])
              (pTVar12,1);
LAB_0038ab3f:
    *local_190 = (TIntermTyped *)pTVar12;
    break;
  case 0x2c9:
    pTVar16 = (TIntermBinary *)
              decomposeStructBufferMethods::anon_class_24_3_252b1faa::operator()(&local_180,1);
    goto LAB_0038a8ab;
  case 0x2ca:
    pTVar9 = decomposeStructBufferMethods::anon_class_24_3_252b1faa::operator()(&local_180,-1);
    pTVar20 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    pTVar13 = TIntermediate::addConstantUnion(pTVar20,-1,loc,true);
    iVar4 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar9);
    pTVar16 = TIntermediate::addBinaryNode
                        (pTVar20,EOpAdd,pTVar9,&pTVar13->super_TIntermTyped,loc,
                         (TType *)CONCAT44(extraout_var_16,iVar4));
    goto LAB_0038a8ab;
  case 0x2cb:
    pTVar14 = decomposeStructBufferMethods::anon_class_24_3_252b1faa::operator()(&local_180,-1);
    pTVar20 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    pTVar13 = TIntermediate::addConstantUnion(pTVar20,-1,loc,true);
    iVar4 = (*(pTVar14->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar14);
    pTVar16 = TIntermediate::addBinaryNode
                        (pTVar20,EOpAdd,pTVar14,&pTVar13->super_TIntermTyped,loc,
                         (TType *)CONCAT44(extraout_var_11,iVar4));
    pTVar14 = TIntermediate::addIndex
                        ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                         EOpIndexIndirect,pTVar9,(TIntermTyped *)pTVar16,loc);
    *node = pTVar14;
    pp_Var17 = (pTVar9->super_TIntermNode)._vptr_TIntermNode;
LAB_0038a7c1:
    iVar4 = (*pp_Var17[0x1e])(pTVar9);
    TType::TType(&local_160,(TType *)CONCAT44(extraout_var_15,iVar4),0,false);
    (*((*node)->super_TIntermNode)._vptr_TIntermNode[0x1d])(*node,&local_160);
    break;
  case 0x2d5:
    pTVar14 = decomposeStructBufferMethods::anon_class_24_3_252b1faa::operator()(&local_180,1);
    pTVar14 = TIntermediate::addIndex
                        ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                         EOpIndexIndirect,pTVar9,pTVar14,loc);
    lVar8 = (**(code **)(*plVar7 + 400))(plVar7);
    pTVar15 = (TIntermTyped *)(**(code **)(**(long **)(*(long *)(lVar8 + 8) + 8) + 0x18))();
    iVar4 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar9);
    TType::TType(&local_160,(TType *)CONCAT44(extraout_var_12,iVar4),0,false);
    (*(pTVar14->super_TIntermNode)._vptr_TIntermNode[0x1d])(pTVar14,&local_160);
    pTVar16 = (TIntermBinary *)
              TIntermediate::addAssign
                        ((this->super_TParseContextBase).super_TParseVersions.intermediate,EOpAssign
                         ,pTVar14,pTVar15,loc);
LAB_0038a8ab:
    *node = (TIntermTyped *)pTVar16;
  }
  return;
}

Assistant:

void HlslParseContext::decomposeStructBufferMethods(const TSourceLoc& loc, TIntermTyped*& node, TIntermNode* arguments)
{
    if (node == nullptr || node->getAsOperator() == nullptr || arguments == nullptr)
        return;

    const TOperator op  = node->getAsOperator()->getOp();
    TIntermAggregate* argAggregate = arguments->getAsAggregate();

    // Buffer is the object upon which method is called, so always arg 0
    TIntermTyped* bufferObj = nullptr;

    // The parameters can be an aggregate, or just a the object as a symbol if there are no fn params.
    if (argAggregate) {
        if (argAggregate->getSequence().empty())
            return;
        if (argAggregate->getSequence()[0])
            bufferObj = argAggregate->getSequence()[0]->getAsTyped();
    } else {
        bufferObj = arguments->getAsSymbolNode();
    }

    if (bufferObj == nullptr || bufferObj->getAsSymbolNode() == nullptr)
        return;

    // Some methods require a hidden internal counter, obtained via getStructBufferCounter().
    // This lambda adds something to it and returns the old value.
    const auto incDecCounter = [&](int incval) -> TIntermTyped* {
        TIntermTyped* incrementValue = intermediate.addConstantUnion(static_cast<unsigned int>(incval), loc, true);
        TIntermTyped* counter = getStructBufferCounter(loc, bufferObj); // obtain the counter member

        if (counter == nullptr)
            return nullptr;

        TIntermAggregate* counterIncrement = new TIntermAggregate(EOpAtomicAdd);
        counterIncrement->setType(TType(EbtUint, EvqTemporary));
        counterIncrement->setLoc(loc);
        counterIncrement->getSequence().push_back(counter);
        counterIncrement->getSequence().push_back(incrementValue);

        return counterIncrement;
    };

    // Index to obtain the runtime sized array out of the buffer.
    TIntermTyped* argArray = indexStructBufferContent(loc, bufferObj);
    if (argArray == nullptr)
        return;  // It might not be a struct buffer method.

    switch (op) {
    case EOpMethodLoad:
        {
            TIntermTyped* argIndex = makeIntegerIndex(argAggregate->getSequence()[1]->getAsTyped());  // index

            const TType& bufferType = bufferObj->getType();

            const TBuiltInVariable builtInType = bufferType.getQualifier().declaredBuiltIn;

            // Byte address buffers index in bytes (only multiples of 4 permitted... not so much a byte address
            // buffer then, but that's what it calls itself.
            const bool isByteAddressBuffer = (builtInType == EbvByteAddressBuffer   ||
                                              builtInType == EbvRWByteAddressBuffer);


            if (isByteAddressBuffer)
                argIndex = intermediate.addBinaryNode(EOpRightShift, argIndex,
                                                      intermediate.addConstantUnion(2, loc, true),
                                                      loc, TType(EbtInt));

            // Index into the array to find the item being loaded.
            const TOperator idxOp = (argIndex->getQualifier().storage == EvqConst) ? EOpIndexDirect : EOpIndexIndirect;

            node = intermediate.addIndex(idxOp, argArray, argIndex, loc);

            const TType derefType(argArray->getType(), 0);
            node->setType(derefType);
        }

        break;

    case EOpMethodLoad2:
    case EOpMethodLoad3:
    case EOpMethodLoad4:
        {
            TIntermTyped* argIndex = makeIntegerIndex(argAggregate->getSequence()[1]->getAsTyped());  // index

            TOperator constructOp = EOpNull;
            int size = 0;

            switch (op) {
            case EOpMethodLoad2: size = 2; constructOp = EOpConstructVec2; break;
            case EOpMethodLoad3: size = 3; constructOp = EOpConstructVec3; break;
            case EOpMethodLoad4: size = 4; constructOp = EOpConstructVec4; break;
            default: assert(0);
            }

            TIntermTyped* body = nullptr;

            // First, we'll store the address in a variable to avoid multiple shifts
            // (we must convert the byte address to an item address)
            TIntermTyped* byteAddrIdx = intermediate.addBinaryNode(EOpRightShift, argIndex,
                                                                   intermediate.addConstantUnion(2, loc, true),
                                                                   loc, TType(EbtInt));

            TVariable* byteAddrSym = makeInternalVariable("byteAddrTemp", TType(EbtInt, EvqTemporary));
            TIntermTyped* byteAddrIdxVar = intermediate.addSymbol(*byteAddrSym, loc);

            body = intermediate.growAggregate(body, intermediate.addAssign(EOpAssign, byteAddrIdxVar, byteAddrIdx, loc));

            TIntermTyped* vec = nullptr;

            // These are only valid on (rw)byteaddressbuffers, so we can always perform the >>2
            // address conversion.
            for (int idx=0; idx<size; ++idx) {
                TIntermTyped* offsetIdx = byteAddrIdxVar;

                // add index offset
                if (idx != 0)
                    offsetIdx = intermediate.addBinaryNode(EOpAdd, offsetIdx,
                                                           intermediate.addConstantUnion(idx, loc, true),
                                                           loc, TType(EbtInt));

                const TOperator idxOp = (offsetIdx->getQualifier().storage == EvqConst) ? EOpIndexDirect
                                                                                        : EOpIndexIndirect;

                TIntermTyped* indexVal = intermediate.addIndex(idxOp, argArray, offsetIdx, loc);

                TType derefType(argArray->getType(), 0);
                derefType.getQualifier().makeTemporary();
                indexVal->setType(derefType);

                vec = intermediate.growAggregate(vec, indexVal);
            }

            vec->setType(TType(argArray->getBasicType(), EvqTemporary, size));
            vec->getAsAggregate()->setOperator(constructOp);

            body = intermediate.growAggregate(body, vec);
            body->setType(vec->getType());
            body->getAsAggregate()->setOperator(EOpSequence);

            node = body;
        }

        break;

    case EOpMethodStore:
    case EOpMethodStore2:
    case EOpMethodStore3:
    case EOpMethodStore4:
        {
            TIntermTyped* argIndex = makeIntegerIndex(argAggregate->getSequence()[1]->getAsTyped());  // index
            TIntermTyped* argValue = argAggregate->getSequence()[2]->getAsTyped();  // value

            // Index into the array to find the item being loaded.
            // Byte address buffers index in bytes (only multiples of 4 permitted... not so much a byte address
            // buffer then, but that's what it calls itself).

            int size = 0;

            switch (op) {
            case EOpMethodStore:  size = 1; break;
            case EOpMethodStore2: size = 2; break;
            case EOpMethodStore3: size = 3; break;
            case EOpMethodStore4: size = 4; break;
            default: assert(0);
            }

            TIntermAggregate* body = nullptr;

            // First, we'll store the address in a variable to avoid multiple shifts
            // (we must convert the byte address to an item address)
            TIntermTyped* byteAddrIdx = intermediate.addBinaryNode(EOpRightShift, argIndex,
                                                                   intermediate.addConstantUnion(2, loc, true), loc, TType(EbtInt));

            TVariable* byteAddrSym = makeInternalVariable("byteAddrTemp", TType(EbtInt, EvqTemporary));
            TIntermTyped* byteAddrIdxVar = intermediate.addSymbol(*byteAddrSym, loc);

            body = intermediate.growAggregate(body, intermediate.addAssign(EOpAssign, byteAddrIdxVar, byteAddrIdx, loc));

            for (int idx=0; idx<size; ++idx) {
                TIntermTyped* offsetIdx = byteAddrIdxVar;
                TIntermTyped* idxConst = intermediate.addConstantUnion(idx, loc, true);

                // add index offset
                if (idx != 0)
                    offsetIdx = intermediate.addBinaryNode(EOpAdd, offsetIdx, idxConst, loc, TType(EbtInt));

                const TOperator idxOp = (offsetIdx->getQualifier().storage == EvqConst) ? EOpIndexDirect
                                                                                        : EOpIndexIndirect;

                TIntermTyped* lValue = intermediate.addIndex(idxOp, argArray, offsetIdx, loc);
                const TType derefType(argArray->getType(), 0);
                lValue->setType(derefType);

                TIntermTyped* rValue;
                if (size == 1) {
                    rValue = argValue;
                } else {
                    rValue = intermediate.addIndex(EOpIndexDirect, argValue, idxConst, loc);
                    const TType indexType(argValue->getType(), 0);
                    rValue->setType(indexType);
                }

                TIntermTyped* assign = intermediate.addAssign(EOpAssign, lValue, rValue, loc);

                body = intermediate.growAggregate(body, assign);
            }

            body->setOperator(EOpSequence);
            node = body;
        }

        break;

    case EOpMethodGetDimensions:
        {
            const int numArgs = (int)argAggregate->getSequence().size();
            TIntermTyped* argNumItems = argAggregate->getSequence()[1]->getAsTyped();  // out num items
            TIntermTyped* argStride   = numArgs > 2 ? argAggregate->getSequence()[2]->getAsTyped() : nullptr;  // out stride

            TIntermAggregate* body = nullptr;

            // Length output:
            if (argArray->getType().isSizedArray()) {
                const int length = argArray->getType().getOuterArraySize();
                TIntermTyped* assign = intermediate.addAssign(EOpAssign, argNumItems,
                                                              intermediate.addConstantUnion(length, loc, true), loc);
                body = intermediate.growAggregate(body, assign, loc);
            } else {
                TIntermTyped* lengthCall = intermediate.addBuiltInFunctionCall(loc, EOpArrayLength, true, argArray,
                                                                               argNumItems->getType());
                TIntermTyped* assign = intermediate.addAssign(EOpAssign, argNumItems, lengthCall, loc);
                body = intermediate.growAggregate(body, assign, loc);
            }

            // Stride output:
            if (argStride != nullptr) {
                int size;
                int stride;
                intermediate.getMemberAlignment(argArray->getType(), size, stride, argArray->getType().getQualifier().layoutPacking,
                                                argArray->getType().getQualifier().layoutMatrix == ElmRowMajor);

                TIntermTyped* assign = intermediate.addAssign(EOpAssign, argStride,
                                                              intermediate.addConstantUnion(stride, loc, true), loc);

                body = intermediate.growAggregate(body, assign);
            }

            body->setOperator(EOpSequence);
            node = body;
        }

        break;

    case EOpInterlockedAdd:
    case EOpInterlockedAnd:
    case EOpInterlockedExchange:
    case EOpInterlockedMax:
    case EOpInterlockedMin:
    case EOpInterlockedOr:
    case EOpInterlockedXor:
    case EOpInterlockedCompareExchange:
    case EOpInterlockedCompareStore:
        {
            // We'll replace the first argument with the block dereference, and let
            // downstream decomposition handle the rest.

            TIntermSequence& sequence = argAggregate->getSequence();

            TIntermTyped* argIndex     = makeIntegerIndex(sequence[1]->getAsTyped());  // index
            argIndex = intermediate.addBinaryNode(EOpRightShift, argIndex, intermediate.addConstantUnion(2, loc, true),
                                                  loc, TType(EbtInt));

            const TOperator idxOp = (argIndex->getQualifier().storage == EvqConst) ? EOpIndexDirect : EOpIndexIndirect;
            TIntermTyped* element = intermediate.addIndex(idxOp, argArray, argIndex, loc);

            const TType derefType(argArray->getType(), 0);
            element->setType(derefType);

            // Replace the numeric byte offset parameter with array reference.
            sequence[1] = element;
            sequence.erase(sequence.begin(), sequence.begin()+1);
        }
        break;

    case EOpMethodIncrementCounter:
        {
            node = incDecCounter(1);
            break;
        }

    case EOpMethodDecrementCounter:
        {
            TIntermTyped* preIncValue = incDecCounter(-1); // result is original value
            node = intermediate.addBinaryNode(EOpAdd, preIncValue, intermediate.addConstantUnion(-1, loc, true), loc,
                                              preIncValue->getType());
            break;
        }

    case EOpMethodAppend:
        {
            TIntermTyped* oldCounter = incDecCounter(1);

            TIntermTyped* lValue = intermediate.addIndex(EOpIndexIndirect, argArray, oldCounter, loc);
            TIntermTyped* rValue = argAggregate->getSequence()[1]->getAsTyped();

            const TType derefType(argArray->getType(), 0);
            lValue->setType(derefType);

            node = intermediate.addAssign(EOpAssign, lValue, rValue, loc);

            break;
        }

    case EOpMethodConsume:
        {
            TIntermTyped* oldCounter = incDecCounter(-1);

            TIntermTyped* newCounter = intermediate.addBinaryNode(EOpAdd, oldCounter,
                                                                  intermediate.addConstantUnion(-1, loc, true), loc,
                                                                  oldCounter->getType());

            node = intermediate.addIndex(EOpIndexIndirect, argArray, newCounter, loc);

            const TType derefType(argArray->getType(), 0);
            node->setType(derefType);

            break;
        }

    default:
        break; // most pass through unchanged
    }
}